

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

void pythonExternalSubset(void *user_data,xmlChar *name,xmlChar *externalID,xmlChar *systemID)

{
  int iVar1;
  PyObject *op;
  PyObject *result;
  PyObject *handler;
  xmlChar *systemID_local;
  xmlChar *externalID_local;
  xmlChar *name_local;
  void *user_data_local;
  
  iVar1 = PyObject_HasAttrString(user_data,"externalSubset");
  if (iVar1 != 0) {
    op = (PyObject *)
         _PyObject_CallMethod_SizeT(user_data,"externalSubset","sss",name,externalID,systemID);
    _Py_XDECREF(op);
  }
  return;
}

Assistant:

static void
pythonExternalSubset(void *user_data,
                     const xmlChar * name,
                     const xmlChar * externalID, const xmlChar * systemID)
{
    PyObject *handler;
    PyObject *result;

#ifdef DEBUG_SAX
    printf("pythonExternalSubset(%s, %s, %s) called\n",
           name, externalID, systemID);
#endif
    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "externalSubset")) {
        result =
            PyObject_CallMethod(handler, (char *) "externalSubset",
                                (char *) "sss", name, externalID,
                                systemID);
        Py_XDECREF(result);
    }
}